

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O3

void __thiscall
nite::FileTransfer::UDPClient::request
          (UDPClient *this,IP_Port *client,string *hash,string *output,FTCallback *callback,
          bool overwrite)

{
  pointer pcVar1;
  bool bVar2;
  Indexer *this_00;
  IndexedFile *file;
  long *plVar3;
  size_t __n;
  size_type *psVar4;
  void *__buf;
  void *__buf_00;
  int __flags;
  UDPClient *pUVar5;
  undefined1 local_318 [8];
  Packet request;
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  string local_78;
  FTCallback *local_58;
  undefined1 local_50 [8];
  string id;
  
  if ((this->sock).opened == false) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "failed to request file \'",hash);
    plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
    local_318 = (undefined1  [8])&request.receiver.ip._M_string_length;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar4) {
      request.receiver.ip._M_string_length = *psVar4;
      request.receiver.ip.field_2._M_allocated_capacity = plVar3[3];
    }
    else {
      request.receiver.ip._M_string_length = *psVar4;
      local_318 = (undefined1  [8])*plVar3;
    }
    request.receiver.ip._M_dataplus._M_p = (pointer)plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    print((string *)local_318);
LAB_00192175:
    if (local_318 != (undefined1  [8])&request.receiver.ip._M_string_length) {
      operator_delete((void *)local_318);
    }
    if (local_50 != (undefined1  [8])&id._M_string_length) {
      operator_delete((void *)local_50);
    }
  }
  else {
    local_58 = callback;
    bVar2 = fileExists(output);
    if (bVar2) {
      if (!overwrite) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,"cannot request FT to output to \'",output);
        plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
        local_318 = (undefined1  [8])&request.receiver.ip._M_string_length;
        psVar4 = (size_type *)(plVar3 + 2);
        if ((size_type *)*plVar3 == psVar4) {
          request.receiver.ip._M_string_length = *psVar4;
          request.receiver.ip.field_2._M_allocated_capacity = plVar3[3];
        }
        else {
          request.receiver.ip._M_string_length = *psVar4;
          local_318 = (undefined1  [8])*plVar3;
        }
        request.receiver.ip._M_dataplus._M_p = (pointer)plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        print((string *)local_318);
        goto LAB_00192175;
      }
      removeFile(output);
    }
    this_00 = getIndexer();
    file = Indexer::indexGhostFile(this_00,output,hash);
    Packet::Packet((Packet *)local_318);
    Packet::setHeader((Packet *)local_318,0);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
    __n = 0;
    pUVar5 = this;
    initFTSession((string *)local_50,file,client,false,this,local_58,&local_78);
    __flags = (int)pUVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    pcVar1 = (hash->_M_dataplus)._M_p;
    request.data._504_8_ = local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(request.data + 0x1f8),pcVar1,pcVar1 + hash->_M_string_length);
    Packet::write((Packet *)local_318,(int)&request + 600,__buf,__n);
    if ((undefined1 *)request.data._504_8_ != local_a8) {
      operator_delete((void *)request.data._504_8_);
    }
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,local_50,id._M_dataplus._M_p + (long)local_50);
    Packet::write((Packet *)local_318,(int)local_98,__buf_00,__n);
    if (local_98[0] != local_88) {
      operator_delete(local_98[0]);
    }
    UDPSocket::send(&this->sock,(int)client,&request.maxSize,request.index,__flags);
    if (local_50 != (undefined1  [8])&id._M_string_length) {
      operator_delete((void *)local_50);
    }
    Packet::~Packet((Packet *)local_318);
  }
  return;
}

Assistant:

void nite::FileTransfer::UDPClient::request(	const nite::IP_Port &client,
												const String &hash, 
												const String &output, 
												const nite::FileTransfer::FTCallback &callback,
												bool overwrite){
	if(!sock.opened){
		nite::print("failed to request file '"+hash+"' from server: socket is not open. run listen() first");
		return;
	}
	if(nite::fileExists(output)){
		if(overwrite){
			nite::removeFile(output);
		}else{
			nite::print("cannot request FT to output to '"+output+"': it already exists and overwritting is not allowed");
			return;
		}
	}
	auto indexer = nite::getIndexer();
	auto file = indexer->indexGhostFile(output, hash);
	nite::Packet request;
	request.setHeader(FTHeader::REQUEST);
	auto id = initFTSession(*file, client, false, this, callback);
	request.write(hash);
	request.write(id);
	sock.send(client, request);
}